

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O1

uint ** gf_matr_mul(uint **a,uint a_rows,uint a_cols,uint **b,uint b_rows,uint b_cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint **ppuVar4;
  uint **ppuVar5;
  undefined4 uVar6;
  uint cols;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_00000034;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  
  puVar10 = (undefined4 *)CONCAT44(in_register_00000034,a_rows);
  if (a_cols == b_rows) {
    ppuVar4 = matrix_new(a_rows,b_cols);
    if (a_rows != 0) {
      uVar11 = 0;
      do {
        if (b_cols != 0) {
          puVar1 = ppuVar4[uVar11];
          uVar12 = 0;
          do {
            puVar1[uVar12] = 0;
            if (b_rows != 0) {
              puVar2 = a[uVar11];
              uVar13 = puVar1[uVar12];
              uVar8 = 0;
              do {
                uVar14 = 0;
                if (((ulong)puVar2[uVar8] != 0) && (b[uVar8][uVar12] != 0)) {
                  uVar14 = index_of[b[uVar8][uVar12]] + index_of[puVar2[uVar8]];
                  uVar3 = (index_of[b[uVar8][uVar12]] - 0xff) + index_of[puVar2[uVar8]];
                  if (uVar14 < 0xff) {
                    uVar3 = uVar14;
                  }
                  uVar14 = alpha_of[uVar3];
                }
                uVar13 = uVar13 ^ uVar14;
                puVar1[uVar12] = uVar13;
                uVar8 = uVar8 + 1;
              } while (b_rows != uVar8);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != b_cols);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != a_rows);
    }
    return ppuVar4;
  }
  gf_matr_mul_cold_1();
  if ((uint)puVar10 != b_rows) {
    gf_matr_mul_vector_cold_1();
    uVar13 = (uint)puVar10;
    if (uVar13 == 2 || uVar13 == cols) {
      uVar3 = gf_matr_det(a,uVar13,cols);
      ppuVar4 = matrix_copy(a,uVar13,cols);
      ppuVar5 = matrix_new(uVar13,cols);
      puVar1 = ppuVar4[1];
      uVar14 = **ppuVar4;
      **ppuVar4 = puVar1[1];
      puVar1[1] = uVar14;
      if (uVar13 != 0) {
        uVar11 = 0;
        do {
          if (cols != 0) {
            puVar1 = ppuVar4[uVar11];
            puVar2 = ppuVar5[uVar11];
            uVar12 = 0;
            do {
              uVar8 = (ulong)puVar1[uVar12];
              if (uVar8 != 0 && uVar3 != 0) {
                iVar7 = index_of[uVar8] - index_of[uVar3];
                iVar9 = iVar7 + 0xff;
                if (-1 < iVar7) {
                  iVar9 = iVar7;
                }
                uVar14 = alpha_of[iVar9];
              }
              else {
                uVar14 = -(uint)(uVar8 != 0);
              }
              puVar2[uVar12] = uVar14;
              uVar12 = uVar12 + 1;
            } while (cols != uVar12);
          }
          uVar11 = uVar11 + 1;
          uVar14 = cols;
        } while (uVar11 != ((ulong)puVar10 & 0xffffffff));
      }
      matrix_free(ppuVar4,uVar13,uVar14);
      return ppuVar5;
    }
    gf_matr_inv_cold_1();
    if ((int)a == 2) {
      ppuVar4 = (uint **)calloc(5,4);
      *ppuVar4 = (uint *)0xe700000074;
      ppuVar4[1] = (uint *)0x1e000000d8;
      *(undefined4 *)(ppuVar4 + 2) = 1;
      uVar6 = 5;
    }
    else {
      if ((int)a != 1) {
        return (uint **)0x0;
      }
      ppuVar4 = (uint **)calloc(2,4);
      *ppuVar4 = (uint *)0x100000002;
      uVar6 = 2;
    }
    if (puVar10 != (undefined4 *)0x0) {
      *puVar10 = uVar6;
    }
    return ppuVar4;
  }
  ppuVar4 = (uint **)calloc((ulong)puVar10 & 0xffffffff,4);
  if ((uint)puVar10 != 0) {
    uVar11 = 0;
    do {
      *(undefined4 *)((long)ppuVar4 + uVar11 * 4) = 0;
      if (b_rows != 0) {
        uVar13 = *(uint *)((long)ppuVar4 + uVar11 * 4);
        uVar12 = 0;
        do {
          uVar14 = 0;
          if (((ulong)a[uVar11][uVar12] != 0) &&
             (uVar3 = *(uint *)((long)b + uVar12 * 4), uVar3 != 0)) {
            uVar14 = index_of[a[uVar11][uVar12]] + index_of[uVar3];
            uVar3 = (index_of[uVar3] - 0xff) + index_of[a[uVar11][uVar12]];
            if (uVar14 < 0xff) {
              uVar3 = uVar14;
            }
            uVar14 = alpha_of[uVar3];
          }
          uVar13 = uVar13 ^ uVar14;
          uVar12 = uVar12 + 1;
        } while (b_rows != uVar12);
        *(uint *)((long)ppuVar4 + uVar11 * 4) = uVar13;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != ((ulong)puVar10 & 0xffffffff));
  }
  return ppuVar4;
}

Assistant:

uint32_t **gf_matr_mul(uint32_t **a, uint32_t a_rows, uint32_t a_cols,
                  uint32_t **b, uint32_t b_rows, uint32_t b_cols)
{
    if (a_cols != b_rows)
        fatal("gf_matr_mul", " a_cols != b_rows\n");

    uint32_t **c = matrix_new(a_rows, b_cols);
    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < b_cols; j++)
        {
            c[i][j] = 0;
            for (uint32_t _k = 0; _k < b_rows; _k++)
                c[i][j] = gf_sum(c[i][j], gf_mul(a[i][_k], b[_k][j]));
        }

    return c;
}